

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseCompressionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentCompression *compression)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  longlong *in_R8;
  int read_status;
  uchar *buf;
  size_t buflen;
  longlong algo;
  long status;
  longlong size_1;
  longlong id;
  bool valid;
  longlong stop;
  longlong pos;
  longlong *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uchar *in_stack_ffffffffffffff88;
  longlong *in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  longlong *local_58;
  long local_50;
  long local_38;
  
  bVar1 = false;
  local_38 = in_RSI;
  do {
    if (in_RSI + in_RDX <= local_38) {
      if (!bVar1) {
        return -2;
      }
      return 0;
    }
    lVar3 = ParseElementHeader(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               (longlong)in_stack_ffffffffffffff88,
                               (longlong *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff78);
    if (lVar3 < 0) {
      return lVar3;
    }
    if (local_50 == 0x4254) {
      in_stack_ffffffffffffff98 =
           (IMkvReader *)
           UnserializeUInt(in_stack_ffffffffffffff98,(longlong)in_stack_ffffffffffffff90,
                           (longlong)in_stack_ffffffffffffff88);
      if ((long)in_stack_ffffffffffffff98 < 0) {
        return -2;
      }
      *in_R8 = (longlong)in_stack_ffffffffffffff98;
      bVar1 = true;
    }
    else if (local_50 == 0x4255) {
      if ((long)local_58 < 1) {
        return -2;
      }
      in_stack_ffffffffffffff90 = local_58;
      in_stack_ffffffffffffff88 =
           SafeArrayAlloc<unsigned_char>
                     ((unsigned_long_long)in_stack_ffffffffffffff88,
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (in_stack_ffffffffffffff88 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**(code **)*in_RCX)
                        (in_RCX,local_38,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (iVar2 != 0) {
        if (in_stack_ffffffffffffff88 == (uchar *)0x0) {
          return lVar3;
        }
        operator_delete__(in_stack_ffffffffffffff88);
        return lVar3;
      }
      if (in_R8[1] != 0) {
        if (in_stack_ffffffffffffff88 != (uchar *)0x0) {
          operator_delete__(in_stack_ffffffffffffff88);
        }
        return -2;
      }
      in_R8[1] = (longlong)in_stack_ffffffffffffff88;
      in_R8[2] = (longlong)in_stack_ffffffffffffff90;
      in_stack_ffffffffffffff84 = 0;
    }
    local_38 = (long)local_58 + local_38;
    if (in_RSI + in_RDX < local_38) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseCompressionEntry(long long start, long long size,
                                            IMkvReader* pReader,
                                            ContentCompression* compression) {
  assert(pReader);
  assert(compression);

  long long pos = start;
  const long long stop = start + size;

  bool valid = false;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompAlgo) {
      long long algo = UnserializeUInt(pReader, pos, size);
      if (algo < 0)
        return E_FILE_FORMAT_INVALID;
      compression->algo = algo;
      valid = true;
    } else if (id == libwebm::kMkvContentCompSettings) {
      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      // There should be only one settings element per content compression.
      if (compression->settings != NULL) {
        delete[] buf;
        return E_FILE_FORMAT_INVALID;
      }

      compression->settings = buf;
      compression->settings_len = buflen;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  // ContentCompAlgo is mandatory
  if (!valid)
    return E_FILE_FORMAT_INVALID;

  return 0;
}